

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O2

void __thiscall TicSpecial::~TicSpecial(TicSpecial *this)

{
  void *block;
  long lVar1;
  
  for (lVar1 = -0x120; lVar1 != 0; lVar1 = lVar1 + 8) {
    block = *(void **)((long)this->used + lVar1);
    if (block != (void *)0x0) {
      M_Free(block);
      *(undefined8 *)((long)this->used + lVar1) = 0;
      *(undefined8 *)((long)&this->streamptr + lVar1) = 0;
    }
  }
  this->okay = false;
  return;
}

Assistant:

~TicSpecial ()
	{
		int i;

		for (i = 0; i < BACKUPTICS; i++)
		{
			if (streams[i])
			{
				M_Free (streams[i]);
				streams[i] = NULL;
				used[i] = 0;
			}
		}
		okay = false;
	}